

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettywriter.h
# Opt level: O0

void __thiscall
rapidjson::
PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::PrettyPrefix(PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
               *this,Type type)

{
  size_t sVar1;
  Level *pLVar2;
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *in_RDI;
  Level *level;
  Ch in_stack_ffffffffffffffdf;
  
  sVar1 = internal::Stack<rapidjson::CrtAllocator>::GetSize
                    (&(in_RDI->
                      super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                      ).level_stack_);
  if (sVar1 == 0) {
    (in_RDI->
    super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ).hasRoot_ = true;
  }
  else {
    pLVar2 = internal::Stack<rapidjson::CrtAllocator>::
             Top<rapidjson::Writer<rapidjson::BasicOStreamWrapper<std::ostream>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>::Level>
                       (&(in_RDI->
                         super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                         ).level_stack_);
    if ((pLVar2->inArray & 1U) == 0) {
      if (pLVar2->valueCount == 0) {
        BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>::Put
                  ((BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)in_RDI
                   ,in_stack_ffffffffffffffdf);
      }
      else if ((pLVar2->valueCount & 1) == 0) {
        BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>::Put
                  ((BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)in_RDI
                   ,in_stack_ffffffffffffffdf);
        BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>::Put
                  ((BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)in_RDI
                   ,in_stack_ffffffffffffffdf);
      }
      else {
        BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>::Put
                  ((BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)in_RDI
                   ,in_stack_ffffffffffffffdf);
        BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>::Put
                  ((BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)in_RDI
                   ,in_stack_ffffffffffffffdf);
      }
      if ((pLVar2->valueCount & 1) == 0) {
        WriteIndent(in_RDI);
      }
    }
    else {
      if ((pLVar2->valueCount != 0) &&
         (BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>::Put
                    ((BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)
                     in_RDI,in_stack_ffffffffffffffdf),
         (in_RDI->formatOptions_ & kFormatSingleLineArray) != kFormatDefault)) {
        BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>::Put
                  ((BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)in_RDI
                   ,in_stack_ffffffffffffffdf);
      }
      if ((in_RDI->formatOptions_ & kFormatSingleLineArray) == kFormatDefault) {
        BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>::Put
                  ((BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)in_RDI
                   ,in_stack_ffffffffffffffdf);
        WriteIndent(in_RDI);
      }
    }
    pLVar2->valueCount = pLVar2->valueCount + 1;
  }
  return;
}

Assistant:

void PrettyPrefix(Type type) {
        (void)type;
        if (Base::level_stack_.GetSize() != 0) { // this value is not at root
            typename Base::Level* level = Base::level_stack_.template Top<typename Base::Level>();

            if (level->inArray) {
                if (level->valueCount > 0) {
                    Base::os_->Put(','); // add comma if it is not the first element in array
                    if (formatOptions_ & kFormatSingleLineArray)
                        Base::os_->Put(' ');
                }

                if (!(formatOptions_ & kFormatSingleLineArray)) {
                    Base::os_->Put('\n');
                    WriteIndent();
                }
            }
            else {  // in object
                if (level->valueCount > 0) {
                    if (level->valueCount % 2 == 0) {
                        Base::os_->Put(',');
                        Base::os_->Put('\n');
                    }
                    else {
                        Base::os_->Put(':');
                        Base::os_->Put(' ');
                    }
                }
                else
                    Base::os_->Put('\n');

                if (level->valueCount % 2 == 0)
                    WriteIndent();
            }
            if (!level->inArray && level->valueCount % 2 == 0)
                RAPIDJSON_ASSERT(type == kStringType);  // if it's in object, then even number should be a name
            level->valueCount++;
        }
        else {
            RAPIDJSON_ASSERT(!Base::hasRoot_);  // Should only has one and only one root.
            Base::hasRoot_ = true;
        }
    }